

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsingleshottimer.cpp
# Opt level: O3

void __thiscall
QSingleShotTimer::QSingleShotTimer
          (QSingleShotTimer *this,Duration interval,TimerType timerType,QObject *r,
          QSlotObjectBase *slotObj)

{
  Data *pDVar1;
  QObject *pQVar2;
  QMetaObject *pQVar3;
  int offset;
  int signal_index;
  long in_FS_OFFSET;
  QObject *local_38;
  
  local_38 = *(QObject **)(in_FS_OFFSET + 0x28);
  signal_index = 0;
  pQVar2 = &QAbstractEventDispatcher::instance((QThread *)0x0)->super_QObject;
  QObject::QObject((QObject *)this,pQVar2);
  *(undefined ***)this = &PTR_metaObject_0069b690;
  *(undefined4 *)(this + 0x10) = 0;
  pQVar3 = &QObject::staticMetaObject;
  do {
    pDVar1 = &pQVar3->d;
    pQVar3 = (pQVar3->d).superdata.direct;
    signal_index = signal_index + pDVar1->data[0xd];
  } while (pQVar3 != (QMetaObject *)0x0);
  pQVar2 = r;
  if (r == (QObject *)0x0) {
    pQVar2 = (QObject *)this;
  }
  QObjectPrivate::connectImpl
            ((QObjectPrivate *)&stack0xffffffffffffffc0,(QObject *)this,signal_index,pQVar2,
             (void **)0x0,slotObj,0,(int *)0x0,&staticMetaObject);
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc0);
  startTimerForReceiver(this,interval,timerType,r);
  if (*(QObject **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSingleShotTimer::QSingleShotTimer(Duration interval, Qt::TimerType timerType,
                                   const QObject *r, QtPrivate::QSlotObjectBase *slotObj)
    : QObject(QAbstractEventDispatcher::instance())
{
    int signal_index = QMetaObjectPrivate::signalOffset(&staticMetaObject);
    Q_ASSERT(QMetaObjectPrivate::signal(&staticMetaObject, signal_index).name() == "timeout");
    QObjectPrivate::connectImpl(this, signal_index, r ? r : this, nullptr, slotObj,
                                Qt::AutoConnection, nullptr, &staticMetaObject);

    startTimerForReceiver(interval, timerType, r);
}